

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Depth_Counter::Depth_Counter
          (Depth_Counter *this,
          ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
          *t_parser)

{
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *pCVar1;
  ulong uVar2;
  eval_error *this_00;
  string local_40;
  File_Position local_20;
  
  this->parser = t_parser;
  uVar2 = t_parser->m_current_parse_depth + 1;
  t_parser->m_current_parse_depth = uVar2;
  if (uVar2 < 0x201) {
    return;
  }
  this_00 = (eval_error *)__cxa_allocate_exception(0x90);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Maximum parse depth exceeded","");
  pCVar1 = this->parser;
  local_20.line = (pCVar1->m_position).line;
  local_20.column = (pCVar1->m_position).col;
  exception::eval_error::eval_error
            (this_00,&local_40,&local_20,
             (pCVar1->m_filename).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

Depth_Counter(ChaiScript_Parser *t_parser)
            : parser(t_parser) {
          ++parser->m_current_parse_depth;
          if (parser->m_current_parse_depth > max_depth) {
            throw exception::eval_error("Maximum parse depth exceeded",
                                        File_Position(parser->m_position.line, parser->m_position.col),
                                        *(parser->m_filename));
          }
        }